

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

unsigned_long_long ZSTD_getFrameContentSize(void *src,size_t srcSize)

{
  size_t sVar1;
  ZSTD_frameHeader zfh;
  void *in_stack_ffffffffffffffb8;
  ZSTD_frameHeader *in_stack_ffffffffffffffc0;
  int local_2c;
  ZSTD_frameHeader *local_8;
  
  sVar1 = ZSTD_getFrameHeader(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x293ac2);
  if (sVar1 == 0) {
    local_8 = in_stack_ffffffffffffffc0;
    if (local_2c == 1) {
      local_8 = (ZSTD_frameHeader *)0x0;
    }
  }
  else {
    local_8 = (ZSTD_frameHeader *)0xfffffffffffffffe;
  }
  return (unsigned_long_long)local_8;
}

Assistant:

unsigned long long ZSTD_getFrameContentSize(const void *src, size_t srcSize)
{
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize)) {
        unsigned long long const ret = ZSTD_getDecompressedSize_legacy(src, srcSize);
        return ret == 0 ? ZSTD_CONTENTSIZE_UNKNOWN : ret;
    }
#endif
    {   ZSTD_frameHeader zfh;
        if (ZSTD_getFrameHeader(&zfh, src, srcSize) != 0)
            return ZSTD_CONTENTSIZE_ERROR;
        if (zfh.frameType == ZSTD_skippableFrame) {
            return 0;
        } else {
            return zfh.frameContentSize;
    }   }
}